

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan_literal(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,char *literal_text,size_t length,token_type return_type)

{
  int_type iVar1;
  ulong local_38;
  size_t i;
  token_type return_type_local;
  size_t length_local;
  char *literal_text_local;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  if (this->current != (int)*literal_text) {
    __assert_fail("current == literal_text[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0xc7f,
                  "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_literal(const char *, const std::size_t, token_type) [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  local_38 = 1;
  while( true ) {
    if (length <= local_38) {
      return return_type;
    }
    iVar1 = get(this);
    if (iVar1 != literal_text[local_38]) break;
    local_38 = local_38 + 1;
  }
  this->error_message = "invalid literal";
  return parse_error;
}

Assistant:

token_type scan_literal(const char* literal_text, const std::size_t length, token_type return_type) {
		assert(current == literal_text[0]);
		for (std::size_t i = 1; i < length; ++i) {
			if (JSON_UNLIKELY(get() != literal_text[i])) {
				error_message = "invalid literal";
				return token_type::parse_error;
			}
		}
		return return_type;
	}